

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O1

void CompareOnTheFlyNode(comparer_context *comp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  string *ctx;
  sliced_chunk_reader reader;
  sliced_chunk_iterator it;
  string local_450;
  undefined1 local_430 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  long local_410;
  
  comparer_context::push_elem(comp,"aiNode");
  paVar1 = &local_450.field_2;
  local_450._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"mName","");
  comparer_context::cmp<aiString>((aiString *)local_430,comp,&local_450);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != paVar1) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  local_450._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"mTransformation","");
  comparer_context::cmp<aiMatrix4x4t<float>>((aiMatrix4x4 *)local_430,comp,&local_450);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != paVar1) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  local_430._0_8_ = &local_420;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"mNumChildren","");
  comparer_context::cmp<unsigned_int>(comp,(string *)local_430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._0_8_ != &local_420) {
    operator_delete((void *)local_430._0_8_,
                    CONCAT71(local_420._M_allocated_capacity._1_7_,local_420._M_local_buf[0]) + 1);
  }
  local_430._0_8_ = &local_420;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"mNumMeshes","");
  uVar2 = comparer_context::cmp<unsigned_int>(comp,(string *)local_430);
  local_450._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"mMeshes","");
  comparer_context::cmp<unsigned_int>(comp,(ulong)uVar2,&local_450);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != paVar1) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._0_8_ != &local_420) {
    operator_delete((void *)local_430._0_8_,
                    CONCAT71(local_420._M_allocated_capacity._1_7_,local_420._M_local_buf[0]) + 1);
  }
  ctx = &local_450;
  local_450._M_dataplus._M_p = (pointer)comp;
  sliced_chunk_reader::begin((sliced_chunk_iterator *)local_430,(sliced_chunk_reader *)ctx);
  while (local_420._M_local_buf[0] != '\x01') {
    if ((float)local_430._8_4_ == 6.54126e-42) {
      CompareOnTheFlyNode(comp);
    }
    sliced_chunk_iterator::cleanup((sliced_chunk_iterator *)local_430,(EVP_PKEY_CTX *)ctx);
    sliced_chunk_iterator::load_next((sliced_chunk_iterator *)local_430);
  }
  fseek(*(FILE **)local_430._0_8_,local_410,0);
  fseek(*(FILE **)(local_430._0_8_ + 8),local_410,0);
  comparer_context::pop_elem(comp);
  return;
}

Assistant:

void CompareOnTheFlyNode(comparer_context& comp)    {
    scoped_chunk chunk(comp,"aiNode");
    comp.cmp<aiString>("mName");
    comp.cmp<aiMatrix4x4>("mTransformation");
    comp.cmp<uint32_t>("mNumChildren");
    comp.cmp<uint32_t>(comp.cmp<uint32_t>("mNumMeshes"),"mMeshes");

    sliced_chunk_reader reader(comp);
    for(sliced_chunk_iterator it = reader.begin(); !it.is_end(); ++it) {
        if ((*it).first == ASSBIN_CHUNK_AINODE) {
            CompareOnTheFlyNode(comp);
        }
    }
}